

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_instructions.c
# Opt level: O1

uint8_t implied_RTI(cpu_registers *registers)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  
  bVar1 = registers->flags;
  bVar2 = pop_stack(registers);
  registers->flags = bVar2 & 0xcf | bVar1 & 0x30;
  uVar3 = pop_stack(registers);
  uVar4 = pop_stack(registers);
  registers->PC = CONCAT11(uVar4,uVar3);
  return '\0';
}

Assistant:

uint8_t implied_RTI(cpu_registers* registers) {
    registers->flags = get_flags_preserve_bits(registers);
    pop_PC_off_stack(registers);
    return ZERO_EXTRA_CYCLES;
}